

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::UnionPackSignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumDef *enum_def,bool inclass)

{
  char *__rhs;
  string local_168;
  byte local_141;
  string local_140;
  byte local_10a;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  EnumDef *pEStack_20;
  bool inclass_local;
  EnumDef *enum_def_local;
  CppGenerator *this_local;
  
  local_10a = 0;
  local_141 = 0;
  local_21 = inclass;
  pEStack_20 = enum_def;
  enum_def_local = (EnumDef *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  if (inclass) {
    std::allocator<char>::allocator();
    local_10a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_109);
  }
  else {
    Name_abi_cxx11_(&local_140,this,&enum_def->super_Definition);
    local_141 = 1;
    std::operator+(&local_108,&local_140,"Union::");
  }
  std::operator+(&local_e8,"::flatbuffers::Offset<void> ",&local_108);
  std::operator+(&local_c8,&local_e8,"Pack(");
  GetBuilder_abi_cxx11_(&local_168,this);
  std::operator+(&local_a8,&local_c8,&local_168);
  std::operator+(&local_88,&local_a8," &_fbb, ");
  std::operator+(&local_68,&local_88,"const ::flatbuffers::rehasher_function_t *_rehasher");
  __rhs = "";
  if ((local_21 & 1) != 0) {
    __rhs = " = nullptr";
  }
  std::operator+(&local_48,&local_68,__rhs);
  std::operator+(__return_storage_ptr__,&local_48,") const");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  if ((local_141 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_140);
  }
  if ((local_10a & 1) != 0) {
    std::allocator<char>::~allocator(&local_109);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnionPackSignature(const EnumDef &enum_def, bool inclass) {
    return "::flatbuffers::Offset<void> " +
           (inclass ? "" : Name(enum_def) + "Union::") + "Pack(" +
           GetBuilder() + " &_fbb, " +
           "const ::flatbuffers::rehasher_function_t *_rehasher" +
           (inclass ? " = nullptr" : "") + ") const";
  }